

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__image
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *buffer;
  bool bVar1;
  byte *pbVar2;
  StringHash SVar3;
  uint64 uVar4;
  int iVar5;
  byte *pbVar6;
  xmlChar **ppxVar7;
  bool failed_2;
  bool failed_1;
  bool failed;
  bool local_43;
  bool local_42;
  bool local_41;
  byte *local_40;
  byte *local_38;
  
  pbVar2 = (byte *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                               ).super_ParserTemplateBase.mStackMemoryManager,0x38);
  pbVar2[0] = 0;
  pbVar2[1] = 0;
  pbVar2[2] = 0;
  pbVar2[3] = 0;
  pbVar2[4] = 0;
  pbVar2[5] = 0;
  pbVar2[6] = 0;
  pbVar2[7] = 0;
  pbVar2[8] = 0;
  pbVar2[9] = 0;
  pbVar2[10] = 0;
  pbVar2[0xb] = 0;
  pbVar2[0xc] = 0;
  pbVar2[0xd] = 0;
  pbVar2[0xe] = 0;
  pbVar2[0xf] = 0;
  pbVar2[0x10] = 0;
  pbVar2[0x11] = 0;
  pbVar2[0x12] = 0;
  pbVar2[0x13] = 0;
  pbVar2[0x14] = 0;
  pbVar2[0x15] = 0;
  pbVar2[0x16] = 0;
  pbVar2[0x17] = 0;
  pbVar2[0x18] = 0;
  pbVar2[0x19] = 0;
  pbVar2[0x1a] = 0;
  pbVar2[0x1b] = 0;
  pbVar2[0x1c] = 0;
  pbVar2[0x1d] = 0;
  pbVar2[0x1e] = 0;
  pbVar2[0x1f] = 0;
  pbVar2[0x20] = 0;
  pbVar2[0x21] = 0;
  pbVar2[0x22] = 0;
  pbVar2[0x23] = 0;
  pbVar2[0x24] = 0;
  pbVar2[0x25] = 0;
  pbVar2[0x26] = 0;
  pbVar2[0x27] = 0;
  pbVar2[0x28] = 0;
  pbVar2[0x29] = 0;
  pbVar2[0x2a] = 0;
  pbVar2[0x2b] = 0;
  pbVar2[0x2c] = 0;
  pbVar2[0x2d] = 0;
  pbVar2[0x2e] = 0;
  pbVar2[0x2f] = 0;
  pbVar2[0x30] = 1;
  pbVar2[0x31] = 0;
  pbVar2[0x32] = 0;
  pbVar2[0x33] = 0;
  pbVar2[0x34] = 0;
  pbVar2[0x35] = 0;
  pbVar2[0x36] = 0;
  pbVar2[0x37] = 0;
  *attributeDataPtr = pbVar2;
  ppxVar7 = attributes->attributes;
  bVar1 = true;
  if (ppxVar7 != (xmlChar **)0x0) {
    local_38 = pbVar2 + 0x18;
    local_40 = pbVar2 + 0x10;
    do {
      text = *ppxVar7;
      if (text == (ParserChar *)0x0) {
        iVar5 = 3;
      }
      else {
        SVar3 = GeneratedSaxParser::Utils::calculateStringHash(text);
        buffer = ppxVar7[1];
        ppxVar7 = ppxVar7 + 2;
        if ((long)SVar3 < 0x7dfba8) {
          pbVar6 = pbVar2 + 8;
          if ((SVar3 == 0x6f4) || (pbVar6 = local_40, SVar3 == 0x74835)) {
LAB_006a8ffb:
            *(ParserChar **)pbVar6 = buffer;
          }
          else {
            if (SVar3 == 0x6ac7a8) {
              uVar4 = GeneratedSaxParser::Utils::toUint64(buffer,&local_41);
              *(uint64 *)(pbVar2 + 0x30) = uVar4;
              if ((local_41 == true) &&
                 (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                    ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                     ERROR_ATTRIBUTE_PARSING_FAILED,0x7037d5,0x6ac7a8,buffer), bVar1
                 )) goto LAB_006a903f;
              iVar5 = 4;
              bVar1 = true;
              goto LAB_006a907e;
            }
LAB_006a9046:
            bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_UNKNOWN_ATTRIBUTE,0x7037d5,text,buffer);
            iVar5 = 1;
            if (bVar1) goto LAB_006a9085;
          }
        }
        else {
          if (SVar3 == 0x7dfba8) {
            uVar4 = GeneratedSaxParser::Utils::toUint64(buffer,&local_43);
            *(uint64 *)(pbVar2 + 0x28) = uVar4;
            if ((local_43 == true) &&
               (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                  ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                   ERROR_ATTRIBUTE_PARSING_FAILED,0x7037d5,0x7dfba8,buffer), bVar1))
            {
LAB_006a903f:
              bVar1 = false;
              iVar5 = 1;
            }
            else {
              iVar5 = 4;
              bVar1 = true;
              if (local_43 == false) {
                *pbVar2 = *pbVar2 | 2;
              }
            }
          }
          else {
            pbVar6 = local_38;
            if (SVar3 == 0x6d69384) goto LAB_006a8ffb;
            if (SVar3 != 0x6ebfdf4) goto LAB_006a9046;
            uVar4 = GeneratedSaxParser::Utils::toUint64(buffer,&local_42);
            *(uint64 *)(pbVar2 + 0x20) = uVar4;
            if ((local_42 == true) &&
               (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                  ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                   ERROR_ATTRIBUTE_PARSING_FAILED,0x7037d5,0x6ebfdf4,buffer), bVar1)
               ) goto LAB_006a903f;
            iVar5 = 4;
            bVar1 = true;
            if (local_42 == false) {
              *pbVar2 = *pbVar2 | 1;
            }
          }
LAB_006a907e:
          if (!bVar1) goto LAB_006a9085;
        }
        iVar5 = 0;
      }
LAB_006a9085:
    } while (iVar5 == 0);
    if (iVar5 == 3) {
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__image( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__image( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

image__AttributeData* attributeData = newData<image__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_id:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_name:
    {

attributeData->name = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->name, strlen(attributeData->name));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_IMAGE,
            HASH_ATTRIBUTE_name,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    case HASH_ATTRIBUTE_format:
    {

attributeData->format = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_height:
    {
bool failed;
attributeData->height = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_IMAGE,
        HASH_ATTRIBUTE_height,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= image__AttributeData::ATTRIBUTE_HEIGHT_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_width:
    {
bool failed;
attributeData->width = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_IMAGE,
        HASH_ATTRIBUTE_width,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= image__AttributeData::ATTRIBUTE_WIDTH_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_depth:
    {
bool failed;
attributeData->depth = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_IMAGE,
        HASH_ATTRIBUTE_depth,
        attributeValue))
{
    return false;
}

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_IMAGE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}